

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-builder.h
# Opt level: O2

void __thiscall
mp::ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_>::BeginPLTerm
          (ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_> *this,int num_breakpoints)

{
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"piecewise-linear term",&local_31);
  TestProblemBuilder::ReportUnhandledConstruct((TestProblemBuilder *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

PLTermBuilder BeginPLTerm(int num_breakpoints) {
    internal::Unused(num_breakpoints);
    MP_DISPATCH(ReportUnhandledConstruct("piecewise-linear term"));
    return PLTermBuilder();
  }